

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Read(VirtualMachine *this)

{
  element_type *peVar1;
  string *val;
  size_type *local_38;
  string read;
  
  local_38 = &read._M_string_length;
  read._M_dataplus._M_p = (pointer)0x0;
  read._M_string_length._0_1_ = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(this->in,(string *)&local_38);
  val = Heap::NewString_abi_cxx11_(&this->heap);
  std::__cxx11::string::_M_assign((string *)val);
  pushString(this,val);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void runtime::VirtualMachine::Read() {
  std::string read;
  std::getline(this->in, read);
  auto ret = this->heap.NewString();
  ret->assign(read);
  this->pushString(ret);
  this->advance();
}